

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib558.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  long lVar2;
  uchar a [14];
  undefined6 uStack_18;
  undefined2 local_12;
  undefined6 uStack_10;
  
  uStack_10 = 0xf7e6d5c4b3a2;
  uStack_18 = 0x3e3d3c3b3a2f;
  local_12 = 0x913f;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    iVar1 = 0;
    lVar2 = curl_easy_escape(0,&uStack_18,0xe);
    if (lVar2 != 0) {
      curl_free(lVar2);
    }
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    iVar1 = 0x7e;
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  unsigned char a[] = {0x2f, 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f,
                       0x91, 0xa2, 0xb3, 0xc4, 0xd5, 0xe6, 0xf7};
  CURLcode res = CURLE_OK;
  char *ptr = NULL;
  int asize;

  (void)URL; /* we don't use this */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  ptr = malloc(558);
  Curl_safefree(ptr);

  asize = (int)sizeof(a);
  ptr = curl_easy_escape(NULL, (char *)a, asize);
  if(ptr)
    curl_free(ptr);

  curl_global_cleanup();

  return (int)res;
}